

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DSAPublicKey.cpp
# Opt level: O1

ByteString * __thiscall
DSAPublicKey::serialise(ByteString *__return_storage_ptr__,DSAPublicKey *this)

{
  ByteString local_100;
  ByteString local_d8;
  ByteString local_b0;
  ByteString local_88;
  ByteString local_60;
  ByteString local_38;
  
  ByteString::serialise(&local_88,&this->p);
  ByteString::serialise(&local_b0,&this->q);
  operator+(&local_60,&local_88,&local_b0);
  ByteString::serialise(&local_d8,&this->g);
  operator+(&local_38,&local_60,&local_d8);
  ByteString::serialise(&local_100,&this->y);
  operator+(__return_storage_ptr__,&local_38,&local_100);
  local_100._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_100.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_38._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_38.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_d8._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_d8.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_60._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_60.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_b0._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_b0.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_88._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_88.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return __return_storage_ptr__;
}

Assistant:

ByteString DSAPublicKey::serialise() const
{
	return p.serialise() +
	       q.serialise() +
	       g.serialise() +
	       y.serialise();
}